

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix3.hpp
# Opt level: O2

Quaternion<double> * __thiscall
OpenMD::SquareMatrix3<double>::toQuaternion
          (Quaternion<double> *__return_storage_ptr__,SquareMatrix3<double> *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  Vector<double,_4U>::Vector(&__return_storage_ptr__->super_Vector<double,_4U>);
  dVar1 = (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][0];
  dVar2 = (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1][1];
  dVar3 = (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][2];
  dVar4 = dVar1 + dVar2 + dVar3 + 1.0;
  if (dVar4 <= 2.220446049250313e-16) {
    if ((dVar1 < dVar2) || (dVar1 < dVar3)) {
      if ((dVar2 < dVar1) || (dVar2 < dVar3)) {
        dVar2 = ((dVar3 + 1.0) - dVar1) - dVar2;
        if (dVar2 < 0.0) {
          dVar2 = sqrt(dVar2);
        }
        else {
          dVar2 = SQRT(dVar2);
        }
        dVar2 = 0.5 / dVar2;
        dVar3 = (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][2];
        dVar1 = (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][0];
        (__return_storage_ptr__->super_Vector<double,_4U>).data_[0] =
             dVar2 * ((this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                      [0][1] - (this->super_SquareMatrix<double,_3>).
                               super_RectMatrix<double,_3U,_3U>.data_[1][0]);
        (__return_storage_ptr__->super_Vector<double,_4U>).data_[1] = dVar2 * (dVar1 + dVar3);
        (__return_storage_ptr__->super_Vector<double,_4U>).data_[2] =
             ((this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1][2] +
             (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][1]) *
             dVar2;
        dVar2 = 0.25 / dVar2;
        goto LAB_0014a195;
      }
      dVar3 = ((dVar2 + 1.0) - dVar1) - dVar3;
      if (dVar3 < 0.0) {
        dVar3 = sqrt(dVar3);
      }
      else {
        dVar3 = SQRT(dVar3);
      }
      dVar4 = 0.5 / dVar3;
      dVar2 = (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1][0];
      dVar1 = (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][1];
      (__return_storage_ptr__->super_Vector<double,_4U>).data_[0] =
           dVar4 * ((this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2]
                    [0] - (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                          data_[0][2]);
      (__return_storage_ptr__->super_Vector<double,_4U>).data_[1] = dVar4 * (dVar1 + dVar2);
      (__return_storage_ptr__->super_Vector<double,_4U>).data_[2] = 0.25 / dVar4;
      dVar2 = (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1][2] +
              (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][1];
    }
    else {
      dVar3 = ((dVar1 + 1.0) - dVar2) - dVar3;
      if (dVar3 < 0.0) {
        dVar3 = sqrt(dVar3);
      }
      else {
        dVar3 = SQRT(dVar3);
      }
      dVar4 = 0.5 / dVar3;
      (__return_storage_ptr__->super_Vector<double,_4U>).data_[0] =
           ((this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1][2] -
           (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][1]) *
           dVar4;
      (__return_storage_ptr__->super_Vector<double,_4U>).data_[1] = 0.25 / dVar4;
      (__return_storage_ptr__->super_Vector<double,_4U>).data_[2] =
           ((this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][1] +
           (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1][0]) *
           dVar4;
      dVar2 = (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][2] +
              (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][0];
    }
  }
  else {
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    dVar4 = 0.5 / dVar4;
    (__return_storage_ptr__->super_Vector<double,_4U>).data_[0] = 0.25 / dVar4;
    dVar2 = (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][0];
    dVar1 = (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][2];
    (__return_storage_ptr__->super_Vector<double,_4U>).data_[1] =
         dVar4 * ((this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1][2]
                 - (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2]
                   [1]);
    (__return_storage_ptr__->super_Vector<double,_4U>).data_[2] = dVar4 * (dVar2 - dVar1);
    dVar2 = (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][1] -
            (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1][0];
  }
  dVar2 = dVar2 * dVar4;
LAB_0014a195:
  (__return_storage_ptr__->super_Vector<double,_4U>).data_[3] = dVar2;
  return __return_storage_ptr__;
}

Assistant:

Quaternion<Real> toQuaternion() {
      Quaternion<Real> q;
      Real t, s;
      Real ad1, ad2, ad3;
      t = this->data_[0][0] + this->data_[1][1] + this->data_[2][2] + 1.0;

      if (t > std::numeric_limits<RealType>::epsilon()) {
        s    = 0.5 / sqrt(t);
        q[0] = 0.25 / s;
        q[1] = (this->data_[1][2] - this->data_[2][1]) * s;
        q[2] = (this->data_[2][0] - this->data_[0][2]) * s;
        q[3] = (this->data_[0][1] - this->data_[1][0]) * s;
      } else {
        ad1 = this->data_[0][0];
        ad2 = this->data_[1][1];
        ad3 = this->data_[2][2];

        if (ad1 >= ad2 && ad1 >= ad3) {
          s    = 0.5 / sqrt(1.0 + this->data_[0][0] - this->data_[1][1] -
                            this->data_[2][2]);
          q[0] = (this->data_[1][2] - this->data_[2][1]) * s;
          q[1] = 0.25 / s;
          q[2] = (this->data_[0][1] + this->data_[1][0]) * s;
          q[3] = (this->data_[0][2] + this->data_[2][0]) * s;
        } else if (ad2 >= ad1 && ad2 >= ad3) {
          s    = 0.5 / sqrt(1.0 + this->data_[1][1] - this->data_[0][0] -
                            this->data_[2][2]);
          q[0] = (this->data_[2][0] - this->data_[0][2]) * s;
          q[1] = (this->data_[0][1] + this->data_[1][0]) * s;
          q[2] = 0.25 / s;
          q[3] = (this->data_[1][2] + this->data_[2][1]) * s;
        } else {
          s    = 0.5 / sqrt(1.0 + this->data_[2][2] - this->data_[0][0] -
                            this->data_[1][1]);
          q[0] = (this->data_[0][1] - this->data_[1][0]) * s;
          q[1] = (this->data_[0][2] + this->data_[2][0]) * s;
          q[2] = (this->data_[1][2] + this->data_[2][1]) * s;
          q[3] = 0.25 / s;
        }
      }

      return q;
    }